

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

ConstantValue *
slang::ast::ConversionExpression::convert
          (EvalContext *context,Type *from,Type *to,SourceRange sourceRange,ConstantValue *value,
          ConversionKind conversionKind,Expression *expr,SourceRange operatorRange)

{
  SourceRange sourceRange_00;
  bool bVar1;
  bitwidth_t bVar2;
  EffectiveSign left;
  bitwidth_t bVar3;
  SVInt *this;
  anon_class_24_3_9807ff23 *this_00;
  Type *this_01;
  QueueType *queue;
  undefined8 in_RSI;
  ConstantValue *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  optional<long> oVar8;
  int in_stack_00000010;
  long in_stack_00000018;
  bitwidth_t size_1;
  bool isSigned;
  Type *ct;
  SVQueue result_2;
  span<slang::ConstantValue,_18446744073709551615UL> elems;
  SVQueue *q;
  size_t size;
  bool differs_1;
  bool differs;
  SVInt *newInt;
  SVInt *oldInt;
  anon_class_24_3_9807ff23 addDiag;
  bool checkImplicit;
  ConstantValue *result;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  Diagnostic *in_stack_fffffffffffffbf0;
  __normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
  in_stack_fffffffffffffbf8;
  __normal_iterator<slang::ConstantValue_*,_std::span<slang::ConstantValue,_18446744073709551615UL>_>
  in_stack_fffffffffffffc00;
  SVInt *in_stack_fffffffffffffc08;
  SVInt *in_stack_fffffffffffffc10;
  ConstantValue *in_stack_fffffffffffffc18;
  anon_class_24_3_9807ff23 *in_stack_fffffffffffffc30;
  Type *in_stack_fffffffffffffc38;
  Diagnostic *in_stack_fffffffffffffc40;
  Type *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
  *in_stack_fffffffffffffc60;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
  *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  __optional_ne_t<long,_long> local_383;
  undefined6 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 in_stack_fffffffffffffca7;
  Type *in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  Type *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined1 uVar9;
  bitwidth_t in_stack_fffffffffffffcf4;
  SourceLocation in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd10;
  undefined1 isSigned_00;
  ConstantValue *in_stack_fffffffffffffd18;
  byte local_269;
  allocator<slang::ConstantValue> local_239;
  ConstantValue *local_238;
  ConstantValue *local_230;
  uint32_t local_1d8;
  span<slang::ConstantValue,_18446744073709551615UL> local_1d0;
  allocator<slang::ConstantValue> local_1b9 [89];
  SVQueue *local_160;
  undefined4 local_154;
  ConstantRange local_150;
  anon_class_24_3_9807ff23 *local_148;
  undefined4 local_13c;
  _Optional_payload_base<int> local_138;
  shortreal_t local_130;
  int local_12c;
  _Storage<long,_true> local_128;
  undefined1 local_120;
  real_t local_118;
  long local_110;
  __optional_ne_t<long,_long> local_102;
  undefined1 local_101;
  undefined4 local_100;
  shortreal_t local_fc;
  real_t local_f8;
  undefined1 local_ed;
  undefined4 local_ec;
  undefined4 local_98;
  uint8_t local_91;
  SVInt *local_90;
  SVInt *local_88;
  undefined1 local_69;
  undefined1 *local_68;
  undefined8 local_60;
  undefined8 *local_58;
  bitmask<slang::ast::ASTFlags> local_50;
  byte local_41;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  uVar9 = (undefined1)((ulong)in_stack_fffffffffffffcd0 >> 0x38);
  local_20 = in_RSI;
  local_18 = in_R8;
  local_10 = in_R9;
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x9ec87e);
  if (bVar1) {
    bVar1 = Type::isMatching(in_stack_fffffffffffffca8,
                             (Type *)CONCAT17(in_stack_fffffffffffffca7,
                                              CONCAT16(in_stack_fffffffffffffca6,
                                                       in_stack_fffffffffffffca0)));
    if (bVar1) {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffbf0,
                 (ConstantValue *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    }
    else if ((in_stack_00000010 == 4) || (in_stack_00000010 == 2)) {
      local_40 = local_18;
      local_38 = local_10;
      sourceRange_00.startLoc._4_4_ = in_stack_fffffffffffffcf4;
      sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffcf0;
      sourceRange_00.endLoc = in_stack_fffffffffffffcf8;
      Bitstream::evaluateCast
                (in_stack_fffffffffffffce8,
                 (ConstantValue *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 sourceRange_00,
                 (EvalContext *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (bool)uVar9);
    }
    else {
      local_269 = 0;
      if (in_stack_00000010 == 0) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_50,UnevaluatedBranch);
        bVar1 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffc00._M_current,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffbf8._M_current);
        local_269 = bVar1 ^ 0xff;
      }
      uVar9 = (undefined1)((uint)in_stack_fffffffffffffcf0 >> 0x18);
      local_41 = local_269 & 1;
      local_60 = local_20;
      local_58 = &local_18;
      local_68 = &stack0x00000020;
      bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffffbf0);
      if (bVar1) {
        if ((in_stack_00000010 == 1) &&
           (bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0x9eca19), bVar1)) {
          this = slang::ConstantValue::integer((ConstantValue *)0x9eca2c);
          bVar1 = Type::isSigned((Type *)in_stack_fffffffffffffbf0);
          SVInt::setSigned(this,bVar1);
        }
        local_69 = 0;
        Type::getBitWidth((Type *)in_stack_fffffffffffffbf8._M_current);
        Type::isSigned((Type *)in_stack_fffffffffffffbf0);
        Type::isFourState(in_stack_fffffffffffffc48);
        slang::ConstantValue::convertToInt
                  (in_stack_fffffffffffffd18,(bitwidth_t)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffd10 >> 0x18,0),
                   SUB81((ulong)in_stack_fffffffffffffd10 >> 0x10,0));
        if ((local_41 & 1) != 0) {
          bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0x9ecaed);
          if (bVar1) {
            local_88 = slang::ConstantValue::integer((ConstantValue *)0x9ecb13);
            local_90 = slang::ConstantValue::integer((ConstantValue *)0x9ecb3a);
            bVar1 = SVInt::hasUnknown(local_88);
            if (!bVar1) {
              SVInt::hasUnknown(local_90);
            }
            local_91 = (uint8_t)SVInt::operator!=((SVInt *)in_stack_fffffffffffffbf8._M_current,
                                                  (SVInt *)in_stack_fffffffffffffbf0);
            bVar1 = operator&&(false,(logic_t)0x0);
            if (bVar1) {
              bVar3 = SVInt::getBitWidth(local_88);
              bVar2 = SVInt::getBitWidth(local_90);
              if (bVar3 == bVar2) {
                if (in_stack_00000018 != 0) {
                  left = Expression::getEffectiveSign
                                   ((Expression *)in_stack_fffffffffffffbf0,
                                    SUB41((uint)in_stack_fffffffffffffbec >> 0x18,0));
                  bVar1 = Expression::signMatches(left,Signed);
                  if (bVar1) {
                    return in_RDI;
                  }
                }
                local_ec = 0xd40007;
                convert::anon_class_24_3_9807ff23::operator()
                          (in_stack_fffffffffffffc30,
                           SUB84((ulong)in_stack_fffffffffffffc38 >> 0x20,0));
                ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
              }
              else {
                local_98 = 0x29000c;
                convert::anon_class_24_3_9807ff23::operator()
                          (in_stack_fffffffffffffc30,
                           SUB84((ulong)in_stack_fffffffffffffc38 >> 0x20,0));
                ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                slang::ConstantValue::ConstantValue
                          ((ConstantValue *)in_stack_fffffffffffffbf0,
                           (SVInt *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                Diagnostic::operator<<
                          (in_stack_fffffffffffffbf0,
                           (ConstantValue *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                slang::ConstantValue::ConstantValue
                          ((ConstantValue *)in_stack_fffffffffffffbf0,
                           (SVInt *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                Diagnostic::operator<<
                          (in_stack_fffffffffffffbf0,
                           (ConstantValue *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                slang::ConstantValue::~ConstantValue((ConstantValue *)0x9ecd2e);
                slang::ConstantValue::~ConstantValue((ConstantValue *)0x9ecd3b);
              }
            }
          }
          else {
            bVar1 = slang::ConstantValue::isReal((ConstantValue *)0x9ece6c);
            if ((bVar1) ||
               (bVar1 = slang::ConstantValue::isShortReal((ConstantValue *)0x9ece8f), bVar1)) {
              bVar1 = slang::ConstantValue::isReal((ConstantValue *)0x9eceb5);
              if (bVar1) {
                local_f8 = slang::ConstantValue::real
                                     ((ConstantValue *)
                                      CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
                ;
                dVar7 = real_t::operator_cast_to_double(&local_f8);
                slang::ConstantValue::integer((ConstantValue *)0x9ecf1d);
                dVar6 = SVInt::toDouble(in_stack_fffffffffffffc10);
                local_ed = dVar7 != dVar6;
              }
              else {
                local_fc = slang::ConstantValue::shortReal
                                     ((ConstantValue *)
                                      CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
                ;
                fVar5 = shortreal_t::operator_cast_to_float(&local_fc);
                slang::ConstantValue::integer((ConstantValue *)0x9ecfb8);
                fVar4 = SVInt::toFloat(in_stack_fffffffffffffc10);
                local_ed = fVar5 != fVar4;
              }
              if ((bool)local_ed != false) {
                local_100 = 0x29000c;
                convert::anon_class_24_3_9807ff23::operator()
                          (in_stack_fffffffffffffc30,
                           SUB84((ulong)in_stack_fffffffffffffc38 >> 0x20,0));
                ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                Diagnostic::operator<<
                          (in_stack_fffffffffffffbf0,
                           (ConstantValue *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                Diagnostic::operator<<
                          (in_stack_fffffffffffffbf0,
                           (ConstantValue *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
              }
            }
          }
        }
      }
      else {
        bVar1 = Type::isFloating((Type *)0x9ed104);
        isSigned_00 = (undefined1)((ulong)in_stack_fffffffffffffd10 >> 0x38);
        if (bVar1) {
          local_101 = 0;
          bVar3 = Type::getBitWidth((Type *)in_stack_fffffffffffffbf8._M_current);
          if (bVar3 == 0x20) {
            slang::ConstantValue::convertToShortReal(in_stack_fffffffffffffc18);
          }
          else {
            slang::ConstantValue::convertToReal(in_stack_fffffffffffffc18);
          }
          if (((local_41 & 1) != 0) &&
             (bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0x9ed16e), bVar1)) {
            bVar1 = slang::ConstantValue::isReal((ConstantValue *)0x9ed194);
            if (bVar1) {
              local_118 = slang::ConstantValue::real
                                    ((ConstantValue *)
                                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
              dVar7 = real_t::operator_cast_to_double(&local_118);
              local_110 = (long)dVar7;
              slang::ConstantValue::integer((ConstantValue *)0x9ed212);
              oVar8 = SVInt::as<long>(in_stack_fffffffffffffc10);
              local_128._M_value =
                   oVar8.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
              local_120 = oVar8.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_engaged;
              local_383 = std::operator!=((long *)in_stack_fffffffffffffc00._M_current,
                                          (optional<long> *)in_stack_fffffffffffffbf8._M_current);
            }
            else {
              local_130 = slang::ConstantValue::shortReal
                                    ((ConstantValue *)
                                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
              fVar5 = shortreal_t::operator_cast_to_float(&local_130);
              local_12c = (int)fVar5;
              slang::ConstantValue::integer((ConstantValue *)0x9ed2ec);
              local_138 = (_Optional_payload_base<int>)SVInt::as<int>(in_stack_fffffffffffffc08);
              local_383 = std::operator!=((int *)in_stack_fffffffffffffbf0,
                                          (optional<int> *)
                                          CONCAT44(in_stack_fffffffffffffbec,
                                                   in_stack_fffffffffffffbe8));
            }
            local_102 = local_383;
            if (local_383 != false) {
              local_13c = 0x29000c;
              convert::anon_class_24_3_9807ff23::operator()
                        (in_stack_fffffffffffffc30,SUB84((ulong)in_stack_fffffffffffffc38 >> 0x20,0)
                        );
              ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
              ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
              Diagnostic::operator<<
                        (in_stack_fffffffffffffbf0,
                         (ConstantValue *)
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
              Diagnostic::operator<<
                        (in_stack_fffffffffffffbf0,
                         (ConstantValue *)
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            }
          }
        }
        else {
          bVar1 = Type::isString((Type *)0x9ed43d);
          if (bVar1) {
            slang::ConstantValue::convertToStr((ConstantValue *)in_stack_fffffffffffffc68);
          }
          else {
            bVar1 = Type::isUnpackedArray
                              ((Type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                              );
            if ((bVar1) &&
               (bVar1 = Type::isUnpackedArray
                                  ((Type *)CONCAT44(in_stack_fffffffffffffbec,
                                                    in_stack_fffffffffffffbe8)), bVar1)) {
              bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffbf0);
              if (bVar1) {
                this_00 = (anon_class_24_3_9807ff23 *)
                          slang::ConstantValue::size((ConstantValue *)in_stack_fffffffffffffbf0);
                local_148 = this_00;
                local_150 = Type::getFixedRange((Type *)CONCAT44(in_stack_fffffffffffffbec,
                                                                 in_stack_fffffffffffffbe8));
                bVar3 = ConstantRange::width((ConstantRange *)0x9ed4e7);
                if (this_00 != (anon_class_24_3_9807ff23 *)(ulong)bVar3) {
                  local_154 = 0x9000c;
                  convert::anon_class_24_3_9807ff23::operator()
                            (this_00,SUB84((ulong)in_stack_fffffffffffffc38 >> 0x20,0));
                  ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                  Diagnostic::operator<<<unsigned_long>
                            ((Diagnostic *)in_stack_fffffffffffffc00._M_current,
                             (unsigned_long)in_stack_fffffffffffffbf8._M_current);
                  ast::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                  slang::ConstantValue::ConstantValue
                            ((ConstantValue *)in_stack_fffffffffffffbf0,
                             (nullptr_t)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                  return in_RDI;
                }
              }
              bVar1 = Type::isQueue((Type *)0x9ed56b);
              if ((bVar1) || (bVar1 = Type::isQueue((Type *)0x9ed580), !bVar1)) {
                bVar1 = Type::isQueue((Type *)0x9ed696);
                if ((!bVar1) || (bVar1 = Type::isQueue((Type *)0x9ed6ac), bVar1)) {
                  slang::ConstantValue::ConstantValue
                            ((ConstantValue *)in_stack_fffffffffffffbf0,
                             (ConstantValue *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                }
                else {
                  local_1d0 = slang::ConstantValue::elements((ConstantValue *)0x9ed6c1);
                  local_230 = (ConstantValue *)
                              std::span<slang::ConstantValue,_18446744073709551615UL>::begin
                                        ((span<slang::ConstantValue,_18446744073709551615UL> *)
                                         CONCAT44(in_stack_fffffffffffffbec,
                                                  in_stack_fffffffffffffbe8));
                  local_238 = (ConstantValue *)
                              std::span<slang::ConstantValue,_18446744073709551615UL>::end
                                        ((span<slang::ConstantValue,_18446744073709551615UL> *)
                                         in_stack_fffffffffffffbf8._M_current);
                  std::allocator<slang::ConstantValue>::allocator
                            ((allocator<slang::ConstantValue> *)0x9ed70f);
                  SVQueue::
                  deque<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::span<slang::ConstantValue,18446744073709551615ul>>,void>
                            ((SVQueue *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffc00,
                             in_stack_fffffffffffffbf8,
                             (allocator_type *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                  std::allocator<slang::ConstantValue>::~allocator(&local_239);
                  this_01 = Type::getCanonicalType((Type *)in_stack_fffffffffffffbf0);
                  queue = Symbol::as<slang::ast::QueueType>((Symbol *)0x9ed75e);
                  local_1d8 = queue->maxBound;
                  SVQueue::resizeToBound((SVQueue *)in_stack_fffffffffffffbf0);
                  slang::ConstantValue::ConstantValue((ConstantValue *)this_01,(SVQueue *)queue);
                  SVQueue::~SVQueue((SVQueue *)0x9ed7a7);
                }
              }
              else {
                slang::ConstantValue::queue((ConstantValue *)0x9ed596);
                local_160 = CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x9ed59e);
                std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::begin
                          ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::end
                          ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                std::allocator<slang::ConstantValue>::allocator
                          ((allocator<slang::ConstantValue> *)0x9ed5ec);
                std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
                vector<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>,void>
                          ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                           CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                           (allocator_type *)
                           CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
                slang::ConstantValue::ConstantValue
                          ((ConstantValue *)in_stack_fffffffffffffbf0,
                           (Elements *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                          );
                std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                          ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                           in_stack_fffffffffffffc00._M_current);
                std::allocator<slang::ConstantValue>::~allocator(local_1b9);
              }
            }
            else {
              bVar1 = Type::isByteArray((Type *)in_stack_fffffffffffffbf8._M_current);
              if (bVar1) {
                Type::getCanonicalType((Type *)in_stack_fffffffffffffbf0);
                Type::getArrayElementType((Type *)in_stack_fffffffffffffbf8._M_current);
                Type::isSigned((Type *)in_stack_fffffffffffffbf0);
                bVar1 = Type::isQueue((Type *)0x9ed868);
                if (bVar1) {
                  slang::ConstantValue::convertToByteQueue
                            (in_stack_fffffffffffffd18,(bool)isSigned_00);
                }
                else {
                  bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffbf0);
                  if (bVar1) {
                    Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x9ed8b4);
                    ConstantRange::width((ConstantRange *)0x9ed8c0);
                  }
                  slang::ConstantValue::convertToByteArray
                            ((ConstantValue *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
                             (bool)uVar9);
                }
              }
              else {
                bVar1 = Type::isNull((Type *)0x9ed90b);
                if (bVar1) {
                  slang::ConstantValue::ConstantValue
                            ((ConstantValue *)in_stack_fffffffffffffbf0,
                             (ConstantValue *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffbf0,
               (nullptr_t)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  }
  return in_RDI;
}

Assistant:

ConstantValue ConversionExpression::convert(EvalContext& context, const Type& from, const Type& to,
                                            SourceRange sourceRange, ConstantValue&& value,
                                            ConversionKind conversionKind, const Expression* expr,
                                            SourceRange operatorRange) {
    if (!value)
        return nullptr;

    if (from.isMatching(to))
        return std::move(value);

    if (conversionKind == ConversionKind::BitstreamCast ||
        conversionKind == ConversionKind::StreamingConcat) {
        return Bitstream::evaluateCast(to, std::move(value), sourceRange, context,
                                       conversionKind == ConversionKind::StreamingConcat);
    }

    const bool checkImplicit = conversionKind == ConversionKind::Implicit &&
                               !context.astCtx.flags.has(ASTFlags::UnevaluatedBranch);

    auto addDiag = [&](DiagCode code) -> Diagnostic& {
        if (operatorRange.start())
            return context.addDiag(code, operatorRange) << sourceRange;
        else
            return context.addDiag(code, sourceRange);
    };

    if (to.isIntegral()) {
        // [11.8.2] last bullet says: the operand shall be sign-extended only if the propagated type
        // is signed. It is different from [11.8.3] ConstantValue::convertToInt uses.
        // ConversionKind::Propagated marked in Expression::PropagationVisitor
        if (conversionKind == ConversionKind::Propagated && value.isInteger())
            value.integer().setSigned(to.isSigned());

        auto result = value.convertToInt(to.getBitWidth(), to.isSigned(), to.isFourState());
        if (checkImplicit) {
            if (value.isInteger()) {
                auto& oldInt = value.integer();
                auto& newInt = result.integer();
                if (!oldInt.hasUnknown() && !newInt.hasUnknown() && oldInt != newInt) {
                    if (oldInt.getBitWidth() != newInt.getBitWidth()) {
                        addDiag(diag::ConstantConversion) << from << to << oldInt << newInt;
                    }
                    else {
                        SLANG_ASSERT(oldInt.isSigned() != newInt.isSigned());
                        if (!expr ||
                            !signMatches(expr->getEffectiveSign(/* isForConversion */ true),
                                         EffectiveSign::Signed)) {
                            addDiag(diag::SignConversion) << from << to;
                        }
                    }
                }
            }
            else if (value.isReal() || value.isShortReal()) {
                const bool differs = value.isReal()
                                         ? value.real() != result.integer().toDouble()
                                         : value.shortReal() != result.integer().toFloat();
                if (differs)
                    addDiag(diag::ConstantConversion) << from << to << value << result;
            }
        }

        return result;
    }

    if (to.isFloating()) {
        auto result = to.getBitWidth() == 32 ? value.convertToShortReal() : value.convertToReal();
        if (checkImplicit && value.isInteger()) {
            const bool differs = result.isReal()
                                     ? (int64_t)result.real() != value.integer().as<int64_t>()
                                     : (int32_t)result.shortReal() != value.integer().as<int32_t>();
            if (differs)
                addDiag(diag::ConstantConversion) << from << to << value << result;
        }
        return result;
    }

    if (to.isString())
        return value.convertToStr();

    if (to.isUnpackedArray() && from.isUnpackedArray()) {
        // Conversion to a dynamic array just resizes. Conversion to a fixed array
        // must have the same number of elements in the source.
        SLANG_ASSERT(!to.hasFixedRange() || !from.hasFixedRange());
        if (to.hasFixedRange()) {
            size_t size = value.size();
            if (size != to.getFixedRange().width()) {
                addDiag(diag::ConstEvalDynamicToFixedSize) << from << size << to;
                return nullptr;
            }
        }

        if (!to.isQueue() && from.isQueue()) {
            // Convert from queue to vector.
            auto& q = *value.queue();
            return std::vector(q.begin(), q.end());
        }

        if (to.isQueue() && !from.isQueue()) {
            // Convert from vector to queue.
            auto elems = value.elements();
            SVQueue result(elems.begin(), elems.end());
            result.maxBound = to.getCanonicalType().as<QueueType>().maxBound;
            result.resizeToBound();
            return result;
        }

        return std::move(value);
    }

    if (to.isByteArray()) {
        auto& ct = to.getCanonicalType();
        bool isSigned = ct.getArrayElementType()->isSigned();
        if (ct.isQueue())
            return value.convertToByteQueue(isSigned);

        bitwidth_t size;
        if (ct.hasFixedRange())
            size = ct.as<FixedSizeUnpackedArrayType>().range.width();
        else
            size = 0; // dynamic array use string size

        return value.convertToByteArray(size, isSigned);
    }

    // Null can be assigned to various destination types. It's ok to just
    // keep propagating the null value.
    if (from.isNull())
        return std::move(value);

    SLANG_UNREACHABLE;
}